

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleSampleMaskiTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureSampleMaskiGettersTest::iterate
          (MultisampleTextureSampleMaskiGettersTest *this)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar5;
  GLint int_value;
  GLint gl_max_sample_mask_words_value;
  MultisampleTextureSampleMaskiGettersTest *local_38;
  long lVar4;
  
  local_38 = this;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  gl_max_sample_mask_words_value = 0;
  (**(code **)(lVar4 + 0x868))(0x8e59);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                  ,0x93);
  iVar2 = 0;
  do {
    if (gl_max_sample_mask_words_value <= iVar2) {
      tcu::TestContext::setTestResult
                ((local_38->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
      iVar1 = *(int *)((long)&DAT_0176f8d0 + lVar5);
      (**(code **)(lVar4 + 0x1258))(iVar2,iVar1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"A valid glSampleMaski() call resulted in an error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                      ,0xa2);
      int_value = -1;
      (**(code **)(lVar4 + 0x860))(0x8e52,iVar2,&int_value);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"A valid glGetIntegeri_v() call resulted in an error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                      ,0xa8);
      if (int_value != iVar1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid sample mask reported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                   ,0xac);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureSampleMaskiGettersTest::iterate()
{
	/* Get GL_MAX_SAMPLE_MASK_WORDS value */
	const glw::Functions& gl							 = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_sample_mask_words_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &gl_max_sample_mask_words_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value");

	/* Iterate over valid index & mask values */
	const glw::GLuint  valid_masks[] = { 0, 0xFFFFFFFF, 0xFF000000, 0x00FF0000, 0x0000FF00, 0x000000FF };
	const unsigned int n_valid_masks = sizeof(valid_masks) / sizeof(valid_masks[0]);

	for (int index = 0; index < gl_max_sample_mask_words_value; ++index)
	{
		for (unsigned int n_mask = 0; n_mask < n_valid_masks; ++n_mask)
		{
			glw::GLint mask = valid_masks[n_mask];

			/* Make sure a valid glSampleMaski() call does not result in an error */
			gl.sampleMaski(index, mask);

			GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glSampleMaski() call resulted in an error");

			/* Check the property value as reported by implementation */
			glw::GLint int_value = -1;

			gl.getIntegeri_v(GL_SAMPLE_MASK_VALUE, index, &int_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glGetIntegeri_v() call resulted in an error");

			if (int_value != mask)
			{
				TCU_FAIL("Invalid sample mask reported");
			}
		} /* for (all masks) */
	}	 /* for (all valid index argument values) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}